

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O0

void Cgt_ManDetectFanout_rec(Aig_Man_t *pAig,Aig_Obj_t *pObj,int nOdcMax,Vec_Ptr_t *vFanout)

{
  bool bVar1;
  int iVar2;
  int local_40;
  int local_38;
  int local_34;
  int iFanout;
  int f;
  Aig_Obj_t *pFanout;
  Vec_Ptr_t *vFanout_local;
  int nOdcMax_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *pAig_local;
  
  local_38 = -1;
  iVar2 = Aig_ObjIsCo(pObj);
  if (((iVar2 == 0) && (iVar2 = Aig_ObjLevel(pObj), iVar2 <= nOdcMax)) &&
     (iVar2 = Aig_ObjIsTravIdCurrent(pAig,pObj), iVar2 == 0)) {
    Aig_ObjSetTravIdCurrent(pAig,pObj);
    Vec_PtrPush(vFanout,pObj);
    if (pAig->pFanData == (int *)0x0) {
      __assert_fail("pAig->pFanData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cgt/cgtAig.c"
                    ,100,"void Cgt_ManDetectFanout_rec(Aig_Man_t *, Aig_Obj_t *, int, Vec_Ptr_t *)")
      ;
    }
    local_34 = 0;
    while( true ) {
      bVar1 = false;
      if (local_34 < (int)((uint)(*(ulong *)&pObj->field_0x18 >> 6) & 0x3ffffff)) {
        if (local_34 == 0) {
          local_40 = Aig_ObjFanout0Int(pAig,pObj->Id);
        }
        else {
          local_40 = Aig_ObjFanoutNext(pAig,local_38);
        }
        local_38 = local_40;
        _iFanout = Aig_ManObj(pAig,local_40 >> 1);
        bVar1 = true;
      }
      if (!bVar1) break;
      Cgt_ManDetectFanout_rec(pAig,_iFanout,nOdcMax,vFanout);
      local_34 = local_34 + 1;
    }
  }
  return;
}

Assistant:

void Cgt_ManDetectFanout_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj, int nOdcMax, Vec_Ptr_t * vFanout )
{
    Aig_Obj_t * pFanout;
    int f, iFanout = -1;
    if ( Aig_ObjIsCo(pObj) || Aig_ObjLevel(pObj) > nOdcMax )
        return;
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    Vec_PtrPush( vFanout, pObj );
    Aig_ObjForEachFanout( pAig, pObj, pFanout, iFanout, f )
        Cgt_ManDetectFanout_rec( pAig, pFanout, nOdcMax, vFanout );
}